

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

output_type *
dnet::data_types::vec_flater<int,_2U>::flatten(output_type *__return_storage_ptr__,input_type *arr)

{
  bool bVar1;
  reference __x;
  iterator __first;
  iterator __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_a0;
  const_iterator local_98;
  vector<int,_std::allocator<int>_> local_90;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> res;
  undefined1 local_50 [8];
  vector<int,_std::allocator<int>_> a;
  iterator __end0;
  iterator __begin0;
  input_type *__range3;
  input_type *arr_local;
  vector<int,_std::allocator<int>_> *ret;
  
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  __end0 = std::
           vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ::begin(arr);
  a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)std::
                  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ::end(arr);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
                                     *)&a.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage), bVar1) {
    __x = __gnu_cxx::
          __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
          ::operator*(&__end0);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_50,__x);
    std::vector<int,_std::allocator<int>_>::vector
              (&local_90,(vector<int,_std::allocator<int>_> *)local_50);
    vec_flater<int,_1U>::flatten((output_type *)local_78,&local_90);
    std::vector<int,_std::allocator<int>_>::~vector(&local_90);
    local_a0._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(__return_storage_ptr__)
    ;
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_98,
               &local_a0);
    __first = std::vector<int,_std::allocator<int>_>::begin((output_type *)local_78);
    __last = std::vector<int,_std::allocator<int>_>::end((output_type *)local_78);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,std::allocator<int>> *)__return_storage_ptr__,local_98,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current
              );
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_50);
    __gnu_cxx::
    __normal_iterator<std::vector<int,_std::allocator<int>_>_*,_std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
    ::operator++(&__end0);
  }
  return __return_storage_ptr__;
}

Assistant:

static output_type flatten(input_type arr)
            {
                std::vector<T> ret;
                for (auto a : arr) {
                    std::vector<T> res = vec_flater<T, N - 1>::flatten(a);
                    ret.insert(ret.end(), res.begin(), res.end());
                }
                return ret;
            }